

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O2

bool __thiscall
iDynTree::AttitudeQuaternionEKF::ekfComputeJacobianH
          (AttitudeQuaternionEKF *this,VectorDynSize *x,MatrixDynSize *H)

{
  uint uVar1;
  undefined4 uVar2;
  double dVar3;
  double dVar4;
  size_t sVar5;
  double *pdVar6;
  undefined4 *puVar7;
  char *pcVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined8 local_128;
  UnitQuaternion q;
  MatrixDynSize dhacc_by_dq;
  Index IStack_d8;
  undefined1 local_d0;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_b0;
  Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_90;
  undefined1 local_70 [48];
  variable_if_dynamic<long,__1> local_40;
  variable_if_dynamic<long,__1> vStack_38;
  long local_30;
  
  sVar5 = iDynTree::VectorDynSize::size();
  if (sVar5 != this->m_state_size) {
    pcVar8 = "state size mismatch";
LAB_001dbb03:
    iDynTree::reportError("AttitudeQuaternionEKF","computejacobianH",pcVar8);
    return false;
  }
  sVar5 = iDynTree::MatrixDynSize::rows();
  if ((sVar5 != this->m_output_size) ||
     (sVar5 = iDynTree::MatrixDynSize::cols(), sVar5 != this->m_state_size)) {
    pcVar8 = "jacobian matrix size mismatch";
    goto LAB_001dbb03;
  }
  iDynTree::MatrixDynSize::zero();
  toEigen((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&dhacc_by_dq,x);
  local_70._0_8_ = _dhacc_by_dq;
  local_70._16_8_ = _dhacc_by_dq;
  local_70._24_8_ = IStack_d8;
  local_70[0x20] = local_d0;
  local_70._40_8_ = 0;
  vStack_38.m_value = IStack_d8;
  local_b0.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = q.m_data;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,4,1,0,4,1>,0,Eigen::Stride<0,0>>,Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,4,1,false>>
            ((Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_b0,
             (Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_4,_1,_false>
              *)local_70);
  iDynTree::MatrixDynSize::MatrixDynSize(&dhacc_by_dq);
  iDynTree::MatrixDynSize::resize((ulong)&dhacc_by_dq,3);
  dVar11 = q.m_data[2];
  pdVar6 = (double *)iDynTree::MatrixDynSize::operator()((ulong)&dhacc_by_dq,2);
  *pdVar6 = dVar11;
  pdVar6 = (double *)iDynTree::MatrixDynSize::operator()((ulong)&dhacc_by_dq,0);
  dVar3 = q.m_data[3];
  *pdVar6 = dVar11;
  puVar7 = (undefined4 *)iDynTree::MatrixDynSize::operator()((ulong)&dhacc_by_dq,1);
  local_128._0_4_ = SUB84(dVar3,0);
  uVar2 = (undefined4)local_128;
  local_128._4_4_ = (uint)((ulong)dVar3 >> 0x20);
  uVar1 = local_128._4_4_ ^ 0x80000000;
  local_128 = -dVar3;
  *puVar7 = uVar2;
  puVar7[1] = uVar1;
  pdVar6 = (double *)iDynTree::MatrixDynSize::operator()((ulong)&dhacc_by_dq,0);
  dVar11 = q.m_data[1];
  *pdVar6 = local_128;
  puVar7 = (undefined4 *)iDynTree::MatrixDynSize::operator()((ulong)&dhacc_by_dq,1);
  local_128._0_4_ = SUB84(dVar11,0);
  uVar2 = (undefined4)local_128;
  local_128._4_4_ = (uint)((ulong)dVar11 >> 0x20);
  uVar1 = local_128._4_4_ ^ 0x80000000;
  local_128 = -dVar11;
  *puVar7 = uVar2;
  puVar7[1] = uVar1;
  pdVar6 = (double *)iDynTree::MatrixDynSize::operator()((ulong)&dhacc_by_dq,0);
  dVar11 = q.m_data[0];
  *pdVar6 = local_128;
  puVar7 = (undefined4 *)iDynTree::MatrixDynSize::operator()((ulong)&dhacc_by_dq,2);
  local_128._0_4_ = SUB84(dVar11,0);
  uVar2 = (undefined4)local_128;
  local_128._4_4_ = (uint)((ulong)dVar11 >> 0x20);
  uVar1 = local_128._4_4_ ^ 0x80000000;
  local_128 = -dVar11;
  *puVar7 = uVar2;
  puVar7[1] = uVar1;
  pdVar6 = (double *)iDynTree::MatrixDynSize::operator()((ulong)&dhacc_by_dq,1);
  dVar11 = q.m_data[0];
  *pdVar6 = local_128;
  pdVar6 = (double *)iDynTree::MatrixDynSize::operator()((ulong)&dhacc_by_dq,0);
  dVar3 = q.m_data[2];
  *pdVar6 = dVar11;
  pdVar6 = (double *)iDynTree::MatrixDynSize::operator()((ulong)&dhacc_by_dq,1);
  dVar11 = q.m_data[1];
  *pdVar6 = -dVar3;
  pdVar6 = (double *)iDynTree::MatrixDynSize::operator()((ulong)&dhacc_by_dq,2);
  dVar3 = q.m_data[3];
  *pdVar6 = dVar11;
  pdVar6 = (double *)iDynTree::MatrixDynSize::operator()((ulong)&dhacc_by_dq,2);
  *pdVar6 = -dVar3;
  dVar11 = (this->m_gravity_direction).super_Vector3.m_data[2];
  if ((dVar11 != -1.0) || (NAN(dVar11))) {
    if ((dVar11 != 1.0) || (NAN(dVar11))) {
      iDynTree::reportError
                ("AttitudeQuaternionEKF","computejacobianH",
                 "filter assumes gravity pointing upward or downward only");
      bVar9 = false;
      goto LAB_001dbd74;
    }
    local_b0.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_data = (PointerType)0xc000000000000000;
    toEigen((Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)local_70,
            &dhacc_by_dq);
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
    ::operator*=((DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)local_70,(Scalar *)&local_b0);
  }
  else {
    local_b0.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_data = (PointerType)0x4000000000000000;
    toEigen((Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)local_70,
            &dhacc_by_dq);
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
    ::operator*=((DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)local_70,(Scalar *)&local_b0);
  }
  toEigen(&local_b0,&dhacc_by_dq);
  toEigen(&local_90,H);
  local_70._0_8_ =
       local_90.
       super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_data;
  local_70._16_8_ =
       local_90.
       super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_data;
  local_70._24_8_ =
       local_90.
       super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_rows.m_value;
  local_70._32_8_ =
       local_90.
       super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
       .
       super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
       .m_cols.m_value;
  local_40.m_value = 0;
  vStack_38.m_value = 0;
  local_30 = local_90.
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_cols.m_value;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>,3,4,false>,Eigen::Map<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_3,_4,_false>
              *)local_70,&local_b0);
  dVar3 = q.m_data[3];
  dVar11 = q.m_data[2];
  bVar9 = true;
  if (this->m_output_size == 4) {
    dVar10 = q.m_data[0] * q.m_data[3];
    dVar13 = q.m_data[1] * q.m_data[2];
    pdVar6 = (double *)iDynTree::MatrixDynSize::operator()((ulong)H,3);
    dVar4 = q.m_data[2];
    dVar11 = dVar3 * dVar3 + dVar11 * dVar11;
    dVar12 = 1.0 - (dVar11 + dVar11);
    dVar10 = dVar10 + dVar13;
    dVar11 = dVar10 * dVar10 * 4.0 + dVar12 * dVar12;
    dVar13 = (dVar12 + dVar12) / dVar11;
    *pdVar6 = dVar3 * dVar13;
    pdVar6 = (double *)iDynTree::MatrixDynSize::operator()((ulong)H,3);
    *pdVar6 = dVar4 * dVar13;
    pdVar6 = (double *)iDynTree::MatrixDynSize::operator()((ulong)H,3);
    dVar11 = (dVar10 * -8.0) / dVar11;
    *pdVar6 = q.m_data[1] * dVar13 - q.m_data[2] * dVar11;
    pdVar6 = (double *)iDynTree::MatrixDynSize::operator()((ulong)H,3);
    *pdVar6 = q.m_data[0] * dVar13 - dVar11 * q.m_data[3];
  }
LAB_001dbd74:
  iDynTree::MatrixDynSize::~MatrixDynSize(&dhacc_by_dq);
  return bVar9;
}

Assistant:

bool iDynTree::AttitudeQuaternionEKF::ekfComputeJacobianH(iDynTree::VectorDynSize& x, iDynTree::MatrixDynSize& H)
{
    using iDynTree::toEigen;

    if (x.size() != m_state_size)
    {
        reportError("AttitudeQuaternionEKF", "computejacobianH", "state size mismatch");
        return false;
    }

    if (H.rows() != m_output_size || H.cols() != m_state_size)
    {
        reportError("AttitudeQuaternionEKF", "computejacobianH", "jacobian matrix size mismatch");
        return false;
    }

    H.zero();
    iDynTree::UnitQuaternion q;
    toEigen(q) = toEigen(x).block<4,1>(0, 0);

    iDynTree::MatrixDynSize dhacc_by_dq;
    dhacc_by_dq.resize(3, 4);
    dhacc_by_dq(0, 0) = dhacc_by_dq(2, 2) = q(2);
    dhacc_by_dq(0, 1) = dhacc_by_dq(1, 2) = -q(3);
    dhacc_by_dq(0, 3) = dhacc_by_dq(1, 0) = -q(1);
    dhacc_by_dq(1, 1) = dhacc_by_dq(2, 0) = -q(0);
    dhacc_by_dq(0, 2) = q(0);
    dhacc_by_dq(1, 3) = -q(2);
    dhacc_by_dq(2, 1) = q(1);
    dhacc_by_dq(2, 3) = -q(3);

    if (m_gravity_direction(2) == -1)
    {
        toEigen(dhacc_by_dq) *= 2;
    }
    else if (m_gravity_direction(2) == 1)
    {
        toEigen(dhacc_by_dq) *= -2;
    }
    else
    {
        reportError("AttitudeQuaternionEKF", "computejacobianH", "filter assumes gravity pointing upward or downward only");
        return false;
    }

    toEigen(H).block<3, 4>(0, 0) = toEigen(dhacc_by_dq);

    if (m_output_size == output_dimensions_with_magnetometer)
    {
        double q0q3{q(0)*q(3)};
        double q1q2{q(1)*q(2)};
        double q2squared{q(2)*q(2)};
        double q3squared{q(3)*q(3)};
        double common_factor{(1 - 2*(q2squared + q3squared))};
        double common_factorSquared{common_factor*common_factor};
        double q0q3plusq1q2Squared{((q0q3+q1q2)*(q0q3+q1q2))};
        double denominator{(4*q0q3plusq1q2Squared) + (common_factorSquared)};

        double multiple{(2*common_factor/denominator)};
        double factor{(-8*(q0q3 + q1q2))/denominator};

        H(3, 0) = q(3)*multiple;
        H(3, 1) = q(2)*multiple;
        H(3, 1) = (q(1)*multiple) - (q(2)*factor);
        H(3, 2) = (q(0)*multiple) - (q(3)*factor);
    }

    return true;
}